

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O1

unsigned_short Read<unsigned_short>(IOStream *stream)

{
  int iVar1;
  undefined4 extraout_var;
  runtime_error *this;
  unsigned_short t;
  unsigned_short local_42;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  iVar1 = (*stream->_vptr_IOStream[2])(stream,&local_42,2,1);
  if (CONCAT44(extraout_var,iVar1) == 1) {
    return local_42;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Unexpected EOF","");
  std::runtime_error::runtime_error(this,(string *)local_40);
  *(undefined ***)this = &PTR__runtime_error_0082bce0;
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T Read(IOStream * stream) {
    T t;
    size_t res = stream->Read( &t, sizeof(T), 1 );
    if(res != 1)
        throw DeadlyImportError("Unexpected EOF");
    return t;
}